

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O1

Index wasm::Bits::getMaxBits<wasm::OptimizeInstructions>
                (Expression *curr,OptimizeInstructions *localInfoProvider)

{
  Id IVar1;
  ulong uVar2;
  char *pcVar3;
  bool bVar4;
  int iVar5;
  Index IVar6;
  Index IVar7;
  uint uVar8;
  Expression *pEVar9;
  Index IVar10;
  anon_union_16_6_1532cd5a_for_Literal_0 local_48;
  long local_38;
  
  IVar1 = curr->_id;
  IVar10 = 1;
  if (IVar1 < RefEqId) {
    if (IVar1 == UnaryId) {
      bVar4 = Unary::isRelational((Unary *)curr);
    }
    else {
      if (IVar1 != BinaryId) {
        if (IVar1 == RefIsNullId) {
          return 1;
        }
        goto LAB_009e396a;
      }
      bVar4 = Binary::isRelational((Binary *)curr);
    }
LAB_009e3962:
    if (bVar4 != false) {
      return 1;
    }
  }
  else {
    if (IVar1 == RefEqId) {
      return 1;
    }
    if (IVar1 == RefTestId) {
      return 1;
    }
    if (IVar1 == StringEqId) {
      bVar4 = *(int *)(curr + 1) == 0;
      goto LAB_009e3962;
    }
  }
LAB_009e396a:
  IVar1 = curr->_id;
  if (IVar1 == ConstId) {
    uVar2 = (curr->type).id;
    if (6 < uVar2) goto LAB_009e400b;
    iVar5 = (int)uVar2;
    if (iVar5 == 3) {
      Literal::countLeadingZeroes((Literal *)&local_48.func,(Literal *)(curr + 1));
      if (local_38 != 3) goto LAB_009e4042;
      iVar5 = 0x40;
    }
    else {
      if (iVar5 != 2) {
        handle_unreachable("invalid type",
                           "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                           ,0xa3);
      }
      Literal::countLeadingZeroes((Literal *)&local_48.func,(Literal *)(curr + 1));
      if (local_38 != 2) goto LAB_009e4061;
      iVar5 = 0x20;
    }
    IVar10 = iVar5 - local_48._0_4_;
    Literal::~Literal((Literal *)&local_48.func);
    goto switchD_009e3a57_caseD_1;
  }
  if (curr == (Expression *)0x0 || IVar1 != BinaryId) {
    if (curr == (Expression *)0x0 || IVar1 != UnaryId) {
      if (curr == (Expression *)0x0 || IVar1 != LocalSetId) {
        if (curr != (Expression *)0x0 && IVar1 == LocalGetId) {
          if (localInfoProvider == (OptimizeInstructions *)0x0) {
            __assert_fail("localInfoProvider",
                          "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                          ,0x1c3,
                          "Index wasm::Bits::getMaxBits(Expression *, LocalInfoProvider *) [LocalInfoProvider = wasm::OptimizeInstructions]"
                         );
          }
          IVar10 = (localInfoProvider->localInfo).
                   super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>._M_impl.
                   super__Vector_impl_data._M_start[*(uint *)(curr + 1)].maxBits;
          goto LAB_009e3b2d;
        }
        bVar4 = true;
        IVar10 = 1;
        if ((curr != (Expression *)0x0 && IVar1 == LoadId) &&
           ((local_48.i64 = (curr->type).id, 5 < local_48.func.super_IString.str._M_len ||
            ((0x32UL >> (local_48.func.super_IString.str._M_len & 0x3f) & 1) == 0)))) {
          IVar1 = curr[1]._id;
          IVar10 = (Index)IVar1;
          uVar8 = wasm::Type::getByteSize((Type *)&local_48.func);
          if ((IVar1 < uVar8) && (IVar10 = (uint)IVar1, curr[1].field_0x1 == '\0')) {
            IVar10 = (uint)curr[1]._id << 3;
            goto LAB_009e3b2d;
          }
        }
      }
      else {
        IVar10 = getMaxBits<wasm::OptimizeInstructions>
                           ((Expression *)curr[1].type.id,localInfoProvider);
LAB_009e3b2d:
        bVar4 = false;
      }
      if (bVar4) goto switchD_009e3acc_caseD_6;
      goto LAB_009e3f99;
    }
    switch(*(undefined4 *)(curr + 1)) {
    case 0:
    case 2:
    case 4:
      IVar10 = 6;
      break;
    case 1:
    case 3:
    case 5:
      IVar10 = 7;
      break;
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
switchD_009e3acc_caseD_6:
      bVar4 = true;
      goto LAB_009e3f9b;
    case 0x14:
    case 0x15:
      handle_unreachable("relationals handled before",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0x1a2);
    case 0x16:
switchD_009e3acc_caseD_16:
      IVar6 = getMaxBits<wasm::OptimizeInstructions>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      bVar4 = IVar6 < 0x20;
      goto LAB_009e3f78;
    case 0x17:
    case 0x18:
      IVar6 = getMaxBits<wasm::OptimizeInstructions>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      bVar4 = IVar6 < 0x20;
      goto LAB_009e3f8f;
    default:
      switch(*(undefined4 *)(curr + 1)) {
      case 0x2f:
        IVar6 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar4 = IVar6 < 8;
        goto LAB_009e3f8f;
      case 0x30:
        IVar6 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar4 = IVar6 < 0x10;
LAB_009e3f8f:
        IVar10 = 0x20;
        goto LAB_009e3f95;
      case 0x31:
        IVar6 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar4 = IVar6 < 8;
        break;
      case 0x32:
        IVar6 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider);
        bVar4 = IVar6 < 0x10;
        break;
      case 0x33:
        goto switchD_009e3acc_caseD_16;
      default:
        goto switchD_009e3acc_caseD_6;
      }
LAB_009e3f78:
      IVar10 = 0x40;
LAB_009e3f95:
      if (bVar4) {
        IVar10 = IVar6;
      }
    }
LAB_009e3f99:
    bVar4 = false;
LAB_009e3f9b:
    if (!bVar4) goto switchD_009e3a57_caseD_1;
switchD_009e3a57_caseD_32:
    bVar4 = true;
    goto LAB_009e3fa7;
  }
  IVar10 = 0x20;
  IVar6 = 0x20;
  switch(*(undefined4 *)(curr + 1)) {
  case 0:
    IVar10 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    IVar6 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    if (IVar6 < IVar10) {
      IVar6 = IVar10;
    }
    IVar6 = IVar6 + 1;
    goto LAB_009e3e3a;
  case 1:
  case 0xd:
  case 0xe:
    break;
  case 2:
    IVar10 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    IVar6 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider);
LAB_009e3e37:
    IVar6 = IVar6 + IVar10;
LAB_009e3e3a:
    bVar4 = IVar6 < 0x20;
    IVar10 = 0x20;
    goto LAB_009e3f15;
  case 3:
    pEVar9 = *(Expression **)(curr + 2);
    if ((pEVar9->_id != ConstId) ||
       (IVar7 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar7 == 0x20)) break;
    if (*(long *)(pEVar9 + 2) != 2) {
LAB_009e4061:
      __assert_fail("type == Type::i32",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x120,"int32_t wasm::Literal::geti32() const");
    }
    bVar4 = false;
    IVar10 = IVar6;
    if (-1 < *(int *)(pEVar9 + 1)) {
LAB_009e3e87:
      bVar4 = false;
      IVar6 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>(pEVar9,(DummyLocalInfoProvider *)0x0);
      IVar10 = (IVar7 - IVar6) + 1;
      if ((int)(IVar7 - IVar6) < 0) {
        IVar10 = 0;
      }
      if ((int)IVar7 <= (int)IVar10) {
        IVar10 = IVar7;
      }
    }
    goto LAB_009e3fa7;
  case 4:
  case 0x1d:
    IVar10 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    bVar4 = false;
    if ((*(Expression **)(curr + 2))->_id == ConstId) {
      IVar7 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                        (*(Expression **)(curr + 2),(DummyLocalInfoProvider *)0x0);
      IVar6 = (IVar10 - IVar7) + 1;
      if ((int)(IVar10 - IVar7) < 0) {
        IVar6 = 0;
      }
      if ((int)IVar6 < (int)IVar10) {
        IVar10 = IVar6;
      }
    }
    goto LAB_009e3fa7;
  case 5:
    pcVar3 = *(char **)(curr + 2);
    if ((*pcVar3 != '\x0e') ||
       (IVar6 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar6 == 0x20)) break;
    if (*(long *)(pcVar3 + 0x20) != 2) goto LAB_009e4061;
    uVar8 = ceilLog2(*(uint32_t *)(pcVar3 + 0x10));
LAB_009e3d1f:
    if (uVar8 < IVar6) {
      IVar6 = uVar8;
    }
LAB_009e3f53:
    bVar4 = false;
    IVar10 = IVar6;
    goto LAB_009e3fa7;
  case 6:
    pcVar3 = *(char **)(curr + 2);
    if (*pcVar3 == '\x0e') {
      IVar10 = getMaxBits<wasm::OptimizeInstructions>
                         ((Expression *)curr[1].type.id,localInfoProvider);
      if (*(long *)(pcVar3 + 0x20) != 2) goto LAB_009e4061;
      IVar6 = ceilLog2(*(uint32_t *)(pcVar3 + 0x10));
      goto LAB_009e3bba;
    }
    break;
  case 7:
  case 0x20:
    IVar10 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    IVar6 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    goto LAB_009e3bba;
  case 8:
  case 9:
  case 0x21:
  case 0x22:
    IVar6 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider);
    IVar10 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    if (IVar10 < IVar6) {
      IVar10 = IVar6;
    }
    break;
  case 10:
    pEVar9 = *(Expression **)(curr + 2);
    if (pEVar9->_id == ConstId) {
      IVar10 = getMaxBits<wasm::OptimizeInstructions>
                         ((Expression *)curr[1].type.id,localInfoProvider);
      IVar6 = getEffectiveShifts(pEVar9);
      goto LAB_009e3e37;
    }
    break;
  case 0xb:
    pEVar9 = *(Expression **)(curr + 2);
    if (pEVar9->_id == ConstId) {
      uVar8 = getMaxBits<wasm::OptimizeInstructions>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      bVar4 = false;
      IVar10 = IVar6;
      if (uVar8 == 0x20) goto LAB_009e3fa7;
LAB_009e3f3d:
      IVar10 = getEffectiveShifts(pEVar9);
      IVar6 = uVar8 - IVar10;
      if (uVar8 < IVar10) {
        IVar6 = 0;
      }
      if (uVar8 < IVar10 || uVar8 - IVar10 == 0) {
        IVar6 = 0;
      }
      goto LAB_009e3f53;
    }
    break;
  case 0xc:
    pEVar9 = *(Expression **)(curr + 2);
    bVar4 = false;
    IVar10 = IVar6;
    if (pEVar9->_id == ConstId) {
LAB_009e3d40:
      bVar4 = false;
      IVar6 = getMaxBits<wasm::OptimizeInstructions>
                        ((Expression *)curr[1].type.id,localInfoProvider);
      IVar7 = getEffectiveShifts(pEVar9);
      IVar10 = IVar6 - IVar7;
      if (IVar6 < IVar7) {
        IVar10 = 0;
      }
      if (IVar6 < IVar7 || IVar6 - IVar7 == 0) {
        IVar10 = 0;
      }
    }
    goto LAB_009e3fa7;
  case 0xf:
  case 0x10:
  case 0x11:
  case 0x12:
  case 0x13:
  case 0x14:
  case 0x15:
  case 0x16:
  case 0x17:
  case 0x18:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x39:
  case 0x3a:
  case 0x3b:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x46:
  case 0x47:
  case 0x48:
  case 0x49:
  case 0x4a:
  case 0x4b:
    handle_unreachable("relationals handled before",
                       "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                       ,0x192);
  case 0x19:
    IVar10 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    IVar6 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    if (IVar6 < IVar10) {
      IVar6 = IVar10;
    }
    IVar6 = IVar6 + 1;
    goto LAB_009e3f0c;
  case 0x1a:
  case 0x26:
  case 0x27:
switchD_009e3a57_caseD_1a:
    IVar10 = 0x40;
    break;
  case 0x1b:
    IVar10 = getMaxBits<wasm::OptimizeInstructions>(*(Expression **)(curr + 2),localInfoProvider);
    IVar6 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider);
    IVar6 = IVar6 + IVar10;
    goto LAB_009e3f0c;
  case 0x1c:
    pEVar9 = *(Expression **)(curr + 2);
    IVar10 = 0x40;
    if ((pEVar9->_id != ConstId) ||
       (IVar7 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar7 == 0x40)) break;
    if (*(long *)(pEVar9 + 2) != 3) {
LAB_009e4042:
      __assert_fail("type == Type::i64",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/literal.h"
                    ,0x129,"int64_t wasm::Literal::geti64() const");
    }
    bVar4 = false;
    IVar10 = 0x40;
    if (-1 < *(long *)(pEVar9 + 1)) goto LAB_009e3e87;
    goto LAB_009e3fa7;
  case 0x1e:
    pcVar3 = *(char **)(curr + 2);
    IVar10 = 0x40;
    if ((*pcVar3 == '\x0e') &&
       (IVar6 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)curr[1].type.id,localInfoProvider), IVar6 != 0x40)) {
      if (*(long *)(pcVar3 + 0x20) != 3) goto LAB_009e4042;
      uVar8 = ceilLog2(*(uint64_t *)(pcVar3 + 0x10));
      goto LAB_009e3d1f;
    }
    break;
  case 0x1f:
    pcVar3 = *(char **)(curr + 2);
    if (*pcVar3 != '\x0e') goto switchD_009e3a57_caseD_1a;
    IVar10 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    if (*(long *)(pcVar3 + 0x20) != 3) goto LAB_009e4042;
    IVar6 = ceilLog2(*(uint64_t *)(pcVar3 + 0x10));
LAB_009e3bba:
    bVar4 = IVar6 < IVar10;
    goto LAB_009e3f15;
  case 0x23:
    pEVar9 = *(Expression **)(curr + 2);
    if (pEVar9->_id != ConstId) goto switchD_009e3a57_caseD_1a;
    IVar10 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider)
    ;
    IVar6 = getEffectiveShifts(pEVar9);
    IVar6 = IVar6 + IVar10;
LAB_009e3f0c:
    bVar4 = IVar6 < 0x40;
    IVar10 = 0x40;
LAB_009e3f15:
    if (bVar4) {
      IVar10 = IVar6;
    }
    break;
  case 0x24:
    pEVar9 = *(Expression **)(curr + 2);
    IVar10 = 0x40;
    if (pEVar9->_id != ConstId) break;
    uVar8 = getMaxBits<wasm::OptimizeInstructions>((Expression *)curr[1].type.id,localInfoProvider);
    bVar4 = false;
    IVar10 = 0x40;
    if (uVar8 != 0x40) goto LAB_009e3f3d;
    goto LAB_009e3fa7;
  case 0x25:
    pEVar9 = *(Expression **)(curr + 2);
    bVar4 = false;
    if (pEVar9->_id == ConstId) goto LAB_009e3d40;
    IVar10 = 0x40;
    goto LAB_009e3fa7;
  default:
    goto switchD_009e3a57_caseD_32;
  }
switchD_009e3a57_caseD_1:
  bVar4 = false;
LAB_009e3fa7:
  if (bVar4) {
    uVar2 = (curr->type).id;
    if (6 < uVar2) {
LAB_009e400b:
      __assert_fail("isBasic() && \"Basic type expected\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm-type.h"
                    ,0x1c4,"BasicType wasm::Type::getBasic() const");
    }
    uVar8 = (int)uVar2 - 1;
    if (2 < uVar8) {
      handle_unreachable("invalid type",
                         "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/bits.h"
                         ,0x1d4);
    }
    IVar10 = *(Index *)(&DAT_00e16564 + (ulong)uVar8 * 4);
  }
  return IVar10;
}

Assistant:

Index getMaxBits(Expression* curr,
                 LocalInfoProvider* localInfoProvider = nullptr) {
  if (Properties::emitsBoolean(curr)) {
    return 1;
  }
  if (auto* c = curr->dynCast<Const>()) {
    switch (curr->type.getBasic()) {
      case Type::i32:
        return 32 - c->value.countLeadingZeroes().geti32();
      case Type::i64:
        return 64 - c->value.countLeadingZeroes().geti64();
      default:
        WASM_UNREACHABLE("invalid type");
    }
  } else if (auto* binary = curr->dynCast<Binary>()) {
    switch (binary->op) {
      // 32-bit
      case RotLInt32:
      case RotRInt32:
      case SubInt32:
        return 32;
      case AddInt32: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(32), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt32: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(32), maxBitsLeft + maxBitsRight);
      }
      case DivSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // If either side might be negative, then the result will be negative
          if (maxBitsLeft == 32 || c->value.geti32() < 0) {
            return 32;
          }
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return 32;
      }
      case DivUInt32: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return maxBitsLeft;
      }
      case RemSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 32) {
            return 32;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case RemUInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case AndInt32: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt32:
      case XorInt32: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt32: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          return std::min(Index(32),
                          getMaxBits(binary->left, localInfoProvider) +
                            Bits::getEffectiveShifts(shifts));
        }
        return 32;
      }
      case ShrUInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case ShrSInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 32) {
            return 32;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case RotLInt64:
      case RotRInt64:
      case SubInt64:
        return 64;
      case AddInt64: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(64), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt64: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(64), maxBitsLeft + maxBitsRight);
      }
      case DivSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left or right const value is negative
          if (maxBitsLeft == 64 || c->value.geti64() < 0) {
            return 64;
          }
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return 64;
      }
      case DivUInt64: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          // Apply std::min: Result bits cannot exceed dividend bits
          return std::min(maxBitsLeft,
                          std::max(0, maxBitsLeft - bitsRight + 1));
        }
        return maxBitsLeft;
      }
      case RemSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 64) {
            return 64;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case RemUInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case AndInt64: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt64:
      case XorInt64: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt64: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          return std::min(Index(64),
                          Bits::getEffectiveShifts(shifts) + maxBits);
        }
        return 64;
      }
      case ShrUInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      case ShrSInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 64) {
            return 64;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      // comparisons
      case EqInt32:
      case NeInt32:
      case LtSInt32:
      case LtUInt32:
      case LeSInt32:
      case LeUInt32:
      case GtSInt32:
      case GtUInt32:
      case GeSInt32:
      case GeUInt32:

      case EqInt64:
      case NeInt64:
      case LtSInt64:
      case LtUInt64:
      case LeSInt64:
      case LeUInt64:
      case GtSInt64:
      case GtUInt64:
      case GeSInt64:
      case GeUInt64:

      case EqFloat32:
      case NeFloat32:
      case LtFloat32:
      case LeFloat32:
      case GtFloat32:
      case GeFloat32:

      case EqFloat64:
      case NeFloat64:
      case LtFloat64:
      case LeFloat64:
      case GtFloat64:
      case GeFloat64:
        WASM_UNREACHABLE("relationals handled before");
      default: {
      }
    }
  } else if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
        return 6;
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
        return 7;
      case EqZInt32:
      case EqZInt64:
        WASM_UNREACHABLE("relationals handled before");
      case WrapInt64:
      case ExtendUInt32:
        return std::min(Index(32), getMaxBits(unary->value, localInfoProvider));
      case ExtendS8Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(32) : maxBits;
      }
      case ExtendS16Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(32) : maxBits;
      }
      case ExtendS8Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(64) : maxBits;
      }
      case ExtendS16Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(64) : maxBits;
      }
      case ExtendS32Int64:
      case ExtendSInt32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 32 ? Index(64) : maxBits;
      }
      default: {
      }
    }
  } else if (auto* set = curr->dynCast<LocalSet>()) {
    // a tee passes through the value
    return getMaxBits(set->value, localInfoProvider);
  } else if (auto* get = curr->dynCast<LocalGet>()) {
    // TODO: Should this be optional?
    assert(localInfoProvider);
    return localInfoProvider->getMaxBitsForLocal(get);
  } else if (auto* load = curr->dynCast<Load>()) {
    // if signed, then the sign-extension might fill all the bits
    // if unsigned, then we have a limit
    if (LoadUtils::isSignRelevant(load) && !load->signed_) {
      return 8 * load->bytes;
    }
  }
  switch (curr->type.getBasic()) {
    case Type::i32:
      return 32;
    case Type::i64:
      return 64;
    case Type::unreachable:
      return 64; // not interesting, but don't crash
    default:
      WASM_UNREACHABLE("invalid type");
  }
}